

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O2

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info)

{
  uint uVar1;
  pointer piVar2;
  pointer pvVar3;
  uint *puVar4;
  int *piVar5;
  pointer pmVar6;
  pointer piVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  uint *puVar11;
  reference rVar12;
  int v;
  vector<int,_std::allocator<int>_> to_be_updated;
  vector<int,_std::allocator<int>_> to_be_added;
  change_set cur_move;
  uint local_9c;
  value_type local_98;
  AdjList *local_90;
  int local_84;
  int *local_80;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  value_type local_38;
  
  local_38.node = *node;
  local_38.block =
       (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[local_38.node];
  local_80 = other_block;
  std::vector<change_set,_std::allocator<change_set>_>::push_back(rollback_info,&local_38);
  iVar8 = *to_block;
  (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[*node] = iVar8;
  piVar2 = (block_weights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar10 = piVar2 + iVar8;
  *piVar10 = *piVar10 + 1;
  piVar10 = piVar2 + 2;
  *piVar10 = *piVar10 + -1;
  local_40 = block_weights;
  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](moved_out_of_S,(long)*node);
  *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (G->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (uint *)pvVar3[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  piVar10 = local_80;
  local_90 = G;
  for (puVar11 = *(uint **)&pvVar3[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
      piVar2 = local_58._M_impl.super__Vector_impl_data._M_finish, puVar11 != puVar4;
      puVar11 = puVar11 + 1) {
    local_9c = *puVar11;
    if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[(int)local_9c] < 0) {
      piVar2 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = piVar2[(int)local_9c];
      if (iVar8 == *piVar10) {
        local_98.block = piVar2[(int)local_9c];
        local_98.node = local_9c;
        std::vector<change_set,_std::allocator<change_set>_>::push_back(rollback_info,&local_98);
        (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[(int)local_9c] = 2;
        piVar2 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = piVar2 + *piVar10;
        *piVar10 = *piVar10 + -1;
        piVar10 = piVar2 + 2;
        *piVar10 = *piVar10 + 1;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (moved_out_of_S,(long)(int)local_9c);
        if ((*rVar12._M_p & rVar12._M_mask) == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&local_58,
                     (value_type_conflict1 *)&local_9c);
        }
        pvVar3 = (local_90->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar5 = pvVar3[(int)local_9c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar9 = pvVar3[(int)local_9c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar10 = local_80, piVar9 != piVar5;
            piVar9 = piVar9 + 1) {
          local_84 = *piVar9;
          if (((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_84] < 0) &&
             (iVar8 = (*(((queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>).
                          _M_impl.super__Vector_impl_data._M_start)->super_priority_queue_interface)
                        ._vptr_priority_queue_interface[0xd])(), (char)iVar8 != '\0')) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_78,&local_84);
          }
        }
      }
      else if (iVar8 == 2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_78,(value_type_conflict1 *)&local_9c)
        ;
      }
    }
  }
  local_98.node = 0;
  local_9c = 0;
  for (puVar11 = (uint *)local_58._M_impl.super__Vector_impl_data._M_start;
      piVar7 = local_78._M_impl.super__Vector_impl_data._M_finish, puVar11 != (uint *)piVar2;
      puVar11 = puVar11 + 1) {
    uVar1 = *puVar11;
    compute_gain(this,local_90,uVar1,&local_98.node,(Gain *)&local_9c);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*(pmVar6->super_priority_queue_interface)._vptr_priority_queue_interface[4])
              (pmVar6,(ulong)uVar1,(ulong)(uint)local_98.node);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*pmVar6[1].super_priority_queue_interface._vptr_priority_queue_interface[4])
              (pmVar6 + 1,(ulong)uVar1,(ulong)local_9c);
  }
  for (puVar11 = (uint *)local_78._M_impl.super__Vector_impl_data._M_start;
      puVar11 != (uint *)piVar7; puVar11 = puVar11 + 1) {
    uVar1 = *puVar11;
    compute_gain(this,local_90,uVar1,&local_98.node,(Gain *)&local_9c);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*(pmVar6->super_priority_queue_interface)._vptr_priority_queue_interface[10])
              (pmVar6,(ulong)uVar1,(ulong)(uint)local_98.node);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*pmVar6[1].super_priority_queue_interface._vptr_priority_queue_interface[10])
              (pmVar6 + 1,(ulong)uVar1,(ulong)local_9c);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node])
        {
                if (x[neighbor] < 0) {
                        if (partition_index[neighbor] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if (queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}